

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_impl.h
# Opt level: O0

bool packet::PacketT<TestConfig>::serialize(byte_t *packet_content,data_len_t len,ostream *out)

{
  char *in_RDX;
  uint in_ESI;
  long in_RDI;
  data_len_t wire_len;
  uint32_t local_24;
  char *local_20;
  uint32_t local_14;
  long local_10;
  bool local_1;
  
  if (((in_RDI == 0) || (in_ESI == 0)) || (10 < in_ESI)) {
    local_1 = false;
  }
  else {
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    std::ostream::write(in_RDX,0x10e500);
    local_24 = htonl(local_14);
    std::ostream::write(local_20,(long)&local_24);
    std::ostream::write(local_20,local_10);
    std::ostream::write(local_20,0x10e581);
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool
PacketT<Cfg>::serialize(const byte_t* packet_content, const data_len_t len, std::ostream& out)
{
  if (packet_content == nullptr || len == 0 || len > Cfg::MAX_DATA_LEN) {
      return false;
  }
  if (HEAD_PATTERN_SIZE > 0) {
    out.write(Cfg::HEAD_PATTERN, HEAD_PATTERN_SIZE);
  }

  const data_len_t wire_len = htonl(len);
  out.write(reinterpret_cast<const char*>(&wire_len), sizeof(data_len_t));
  out.write(reinterpret_cast<const char*>(packet_content), len);

  if (TAIL_PATTERN_SIZE > 0) {
    out.write(Cfg::TAIL_PATTERN, HEAD_PATTERN_SIZE);
  }
  return true;
}